

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

void __thiscall
SGParser::Parse<SGParser::ParseStackGenericElement>::Parse
          (Parse<SGParser::ParseStackGenericElement> *this,ParseTable *ptable,size_t stackSize)

{
  size_t stackSize_local;
  ParseTable *ptable_local;
  Parse<SGParser::ParseStackGenericElement> *this_local;
  
  this->pParseTable = (ParseTable *)0x0;
  this->pTokenizer = (TokenStream<SGParser::GenericToken> *)0x0;
  BacktrackingTokenStream<SGParser::GenericToken>::BacktrackingTokenStream(&this->Stream);
  this->StackPosition = 0;
  this->StackSize = 0;
  this->pStack = (ParseStackGenericElement *)0x0;
  this->TopState = 0xffffffff;
  this->NextTokenFlag = false;
  this->PrevTokenIndex = 0xffffffffffffffff;
  GenericToken::GenericToken(&this->Token);
  this->ReduceLeft = 0;
  this->pValidTokenStackPositions = (size_t *)0x0;
  this->ErrorMarker = 0xffffffffffffffff;
  this->LastErrorState = 0xffffffff;
  std::__cxx11::string::string((string *)&this->ErrorStackStr);
  Create(this,ptable,stackSize);
  return;
}

Assistant:

explicit Parse(const ParseTable* ptable = nullptr, size_t stackSize = DefaultStackSize) {
        Create(ptable, stackSize);
    }